

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripNonZeroKeyNonZeroEnum_Test<absl::lts_20250127::Cord>::
~NoFieldPresenceMapSerializeTest_MapRoundTripNonZeroKeyNonZeroEnum_Test
          (NoFieldPresenceMapSerializeTest_MapRoundTripNonZeroKeyNonZeroEnum_Test<absl::lts_20250127::Cord>
           *this)

{
  (this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).super_Test._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceMapSerializeTest_0190d210;
  absl::lts_20250127::Cord::~Cord
            (&(this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).value_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripNonZeroKeyNonZeroEnum) {
  TestAllMapTypes msg;
  ASSERT_NE(static_cast<uint32_t>(FOREIGN_BAZ), 0);
  (*msg.mutable_map_int32_foreign_enum())[99] = FOREIGN_BAZ;

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_foreign_enum(),
              UnorderedPointwise(Eq(), msg.map_int32_foreign_enum()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(FOREIGN_BAZ, rt_msg.map_int32_foreign_enum().at(99));
}